

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall mp::BasicSolver::GetWarning(BasicSolver *this,string *key)

{
  const_iterator cVar1;
  mapped_type *pmVar2;
  
  if (GetWarning(std::__cxx11::string_const&)::dummy_abi_cxx11_ == '\0') {
    GetWarning();
  }
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::find(&(this->warnings_)._M_t,key);
  if (&(this->warnings_)._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)cVar1._M_node) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::at(&this->warnings_,key);
    return pmVar2;
  }
  return &GetWarning(std::__cxx11::string_const&)::dummy_abi_cxx11_;
}

Assistant:

const std::pair<int, std::string>&
BasicSolver::GetWarning(const std::string& key) const {
  static std::pair<int, std::string> dummy;
  const auto& wm = GetWarningsMap();
  if (wm.end() != wm.find(key))
    return wm.at(key);
  return dummy;
}